

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintNumber(_U_SINT number_to_print)

{
  if (number_to_print < 0) {
    putchar(0x2d);
    number_to_print = -number_to_print;
  }
  UnityPrintNumberUnsigned(number_to_print);
  return;
}

Assistant:

void UnityPrintNumber(const _U_SINT number_to_print)
{
    _U_UINT number = (_U_UINT)number_to_print;

    if (number_to_print < 0)
    {
        /* A negative number, including MIN negative */
        UNITY_OUTPUT_CHAR('-');
        number = (_U_UINT)(-number_to_print);
    }
    UnityPrintNumberUnsigned(number);
}